

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyMarkBigBlockList(Recycler *this,BigBlock *memoryBlocks)

{
  void *pvVar1;
  char *pcVar2;
  ulong local_40;
  size_t i;
  size_t slotCount;
  void **base;
  BigBlock *blockp;
  size_t scanRootBytes;
  BigBlock *memoryBlocks_local;
  Recycler *this_local;
  
  for (base = (void **)memoryBlocks; base != (void **)0x0; base = (void **)*base) {
    pcVar2 = BigBlock::GetBytes((BigBlock *)base);
    pvVar1 = base[3];
    for (local_40 = 0; local_40 < (ulong)pvVar1 >> 3; local_40 = local_40 + 1) {
      VerifyMark(this,*(void **)(pcVar2 + local_40 * 8));
    }
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkBigBlockList(BigBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    BigBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->currentByte / sizeof(void*);
        scanRootBytes +=  blockp->currentByte;
        for (size_t i=0; i < slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->nextBigBlock;
    }
}